

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_import_ec_public_key
          (psa_ecc_curve_t curve,uint8_t *data,size_t data_length,mbedtls_ecp_keypair **p_ecp)

{
  mbedtls_ecp_point *pt;
  mbedtls_ecp_keypair *key;
  psa_status_t pVar1;
  int iVar2;
  mbedtls_ecp_keypair *ecp;
  
  ecp = (mbedtls_ecp_keypair *)0x0;
  pVar1 = psa_prepare_import_ec_key(curve,data_length,1,&ecp);
  key = ecp;
  if (pVar1 == 0) {
    pt = &ecp->Q;
    iVar2 = mbedtls_ecp_point_read_binary(&ecp->grp,pt,data,data_length);
    pVar1 = mbedtls_to_psa_error(iVar2);
    if (pVar1 == 0) {
      iVar2 = mbedtls_ecp_check_pubkey(&key->grp,pt);
      pVar1 = mbedtls_to_psa_error(iVar2);
      if (pVar1 == 0) {
        *p_ecp = key;
        return 0;
      }
    }
  }
  if (key != (mbedtls_ecp_keypair *)0x0) {
    mbedtls_ecp_keypair_free(key);
    free(key);
  }
  return pVar1;
}

Assistant:

static psa_status_t psa_import_ec_public_key( psa_ecc_curve_t curve,
                                              const uint8_t *data,
                                              size_t data_length,
                                              mbedtls_ecp_keypair **p_ecp )
{
    psa_status_t status = PSA_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_keypair *ecp = NULL;

    status = psa_prepare_import_ec_key( curve, data_length, 1, &ecp );
    if( status != PSA_SUCCESS )
        goto exit;

    /* Load the public value. */
    status = mbedtls_to_psa_error(
        mbedtls_ecp_point_read_binary( &ecp->grp, &ecp->Q,
                                       data, data_length ) );
    if( status != PSA_SUCCESS )
        goto exit;

    /* Check that the point is on the curve. */
    status = mbedtls_to_psa_error(
        mbedtls_ecp_check_pubkey( &ecp->grp, &ecp->Q ) );
    if( status != PSA_SUCCESS )
        goto exit;

    *p_ecp = ecp;
    return( PSA_SUCCESS );

exit:
    if( ecp != NULL )
    {
        mbedtls_ecp_keypair_free( ecp );
        mbedtls_free( ecp );
    }
    return( status );
}